

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::inf_or_nan_writer::operator()
          (inf_or_nan_writer *this,
          truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it)

{
  inf_or_nan_writer iVar1;
  ulong uVar2;
  size_t sVar3;
  char cVar4;
  inf_or_nan_writer *piVar5;
  char *pcVar6;
  char cVar7;
  char *pcVar8;
  ulong uVar9;
  size_t sVar10;
  inf_or_nan_writer local_8 [8];
  
  iVar1 = *this;
  if (iVar1 != (inf_or_nan_writer)0x0) {
    piVar5 = (inf_or_nan_writer *)(it->super_truncating_iterator_base<char_*>).out_;
    uVar2 = (it->super_truncating_iterator_base<char_*>).count_;
    (it->super_truncating_iterator_base<char_*>).count_ = uVar2 + 1;
    if (uVar2 < (it->super_truncating_iterator_base<char_*>).limit_) {
      (it->super_truncating_iterator_base<char_*>).out_ = (char *)(piVar5 + 1);
    }
    else {
      piVar5 = local_8;
    }
    *piVar5 = iVar1;
  }
  pcVar8 = *(char **)(this + 8);
  pcVar6 = (it->super_truncating_iterator_base<char_*>).out_;
  uVar2 = (it->super_truncating_iterator_base<char_*>).limit_;
  sVar3 = (it->super_truncating_iterator_base<char_*>).count_;
  cVar7 = it->blackhole_;
  uVar9 = 4;
  sVar10 = sVar3;
  do {
    cVar4 = *pcVar8;
    if (sVar10 < uVar2) {
      *pcVar6 = *pcVar8;
      pcVar6 = pcVar6 + 1;
      cVar4 = cVar7;
    }
    cVar7 = cVar4;
    sVar10 = sVar10 + 1;
    pcVar8 = pcVar8 + 1;
    uVar9 = uVar9 - 1;
  } while (1 < uVar9);
  (it->super_truncating_iterator_base<char_*>).out_ = pcVar6;
  (it->super_truncating_iterator_base<char_*>).limit_ = uVar2;
  (it->super_truncating_iterator_base<char_*>).count_ = sVar3 + 3;
  it->blackhole_ = cVar7;
  return;
}

Assistant:

void operator()(It &&it) const {
      if (sign)
        *it++ = static_cast<char_type>(sign);
      it = internal::copy_str<char_type>(
            str, str + static_cast<std::size_t>(INF_SIZE), it);
    }